

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

void imguiSetAa(void)

{
  bool bVar1;
  undefined8 *puVar2;
  
  bVar1 = loadSceneFramebufferTexture();
  if (bVar1) {
    bVar1 = loadSceneFramebuffer();
    if (bVar1) {
      bVar1 = loadViewerProgram();
      if (bVar1) {
        g_framebuffer.flags.reset = true;
        return;
      }
    }
  }
  fwrite("=> Framebuffer config failed <=\n",0x20,1,_stdout);
  fflush(_stdout);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__cxx11::string::operator=;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void imguiSetAa()
{
    if (!loadSceneFramebufferTexture() || !loadSceneFramebuffer()
    || !loadViewerProgram()) {
        LOG("=> Framebuffer config failed <=\n");
        throw std::exception();
    }
    g_framebuffer.flags.reset = true;
}